

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex.hpp
# Opt level: O2

string * __thiscall
viennamath::rt_latex_binary_expr_processor<viennamath::rt_expression_interface<double>>::
process_abi_cxx11_(string *__return_storage_ptr__,void *this,rt_expression_interface<double> *ptr,
                  bool use_parenthesis,
                  rt_latex_translator<viennamath::rt_expression_interface<double>_> *translator)

{
  BinaryExpr *temp;
  BinaryExpr *e;
  allocator<char> local_21;
  
  if ((ptr != (rt_expression_interface<double> *)0x0) &&
     (e = (BinaryExpr *)
          __dynamic_cast(ptr,&rt_expression_interface<double>::typeinfo,
                         &rt_binary_expr<viennamath::rt_expression_interface<double>>::typeinfo,0),
     e != (BinaryExpr *)0x0)) {
    process_impl_abi_cxx11_(__return_storage_ptr__,this,e,use_parenthesis,translator);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_21);
  return __return_storage_ptr__;
}

Assistant:

std::string process(InterfaceType const * ptr, bool use_parenthesis, rt_latex_translator<InterfaceType> const & translator) const
      {
        if (dynamic_cast< const BinaryExpr * >(ptr) != NULL)
        {
          const BinaryExpr * temp = dynamic_cast< const BinaryExpr * >(ptr);
          return process_impl(*temp, use_parenthesis, translator);
        }

        return "";
      }